

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O2

bool __thiscall
llama_kv_cache_unified::state_read_data
          (llama_kv_cache_unified *this,llama_io_read_i *io,uint32_t cell_count)

{
  ggml_tensor *pgVar1;
  llama_io_read_i *plVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint il;
  char *pcVar10;
  ulong uVar11;
  uint32_t j;
  ggml_type gVar12;
  int32_t k_type_i_ref;
  ggml_type local_6c;
  uint32_t local_68;
  uint32_t n_layer;
  uint64_t k_size_row_ref;
  uint32_t v_trans;
  ulong local_50;
  ulong local_48;
  uint32_t n_embd_v_gqa_ref;
  llama_io_read_i *local_38;
  
  (*io->_vptr_llama_io_read_i[3])(io,&v_trans,4);
  (*io->_vptr_llama_io_read_i[3])(io,&n_layer,4);
  uVar7 = (ulong)n_layer;
  if (n_layer == this->hparams->n_layer) {
    if (cell_count <= this->size) {
      if (1 < v_trans) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: incompatible V transposition\n",
                           "state_read_data");
        return false;
      }
      local_50 = (ulong)cell_count;
      local_68 = cell_count;
      for (uVar11 = 0; uVar11 < uVar7; uVar11 = uVar11 + 1) {
        llama_hparams::n_embd_k_gqa(this->hparams,(uint32_t)uVar11);
        llama_hparams::n_embd_k_s(this->hparams);
        (*io->_vptr_llama_io_read_i[3])(io,&k_type_i_ref,4);
        gVar12 = (this->k_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type;
        if (gVar12 != k_type_i_ref) {
          pcVar10 = "%s: mismatched key type (%d != %d, layer %d)\n";
          goto LAB_001f1f4e;
        }
        (*io->_vptr_llama_io_read_i[3])(io,&k_size_row_ref,8);
        uVar6 = ggml_row_size((this->k_l).
                              super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar11]->type);
        uVar7 = CONCAT44(k_size_row_ref._4_4_,(ggml_type)k_size_row_ref);
        if (uVar6 != uVar7) {
          pcVar10 = "%s: mismatched key row size (%zu != %zu, layer %d)\n";
          goto LAB_001f1f69;
        }
        if (cell_count != 0) {
          pgVar1 = (this->k_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11];
          lVar8 = uVar6 * local_50;
          iVar3 = (*io->_vptr_llama_io_read_i[2])(io,lVar8);
          cell_count = local_68;
          ggml_backend_tensor_set(pgVar1,iVar3,this->head * uVar6,lVar8);
        }
        uVar7 = (ulong)n_layer;
      }
      if (v_trans == 0) {
        for (uVar11 = 0; uVar11 < uVar7; uVar11 = uVar11 + 1) {
          uVar4 = llama_hparams::n_embd_v_gqa(this->hparams,(uint32_t)uVar11);
          uVar5 = llama_hparams::n_embd_v_s(this->hparams);
          (*io->_vptr_llama_io_read_i[3])(io,&k_type_i_ref,4);
          gVar12 = (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11]->type;
          if (gVar12 != k_type_i_ref) {
            pcVar10 = "%s: mismatched value type (%d != %d, layer %d)\n";
LAB_001f1f4e:
            uVar11 = uVar11 & 0xffffffff;
            goto LAB_001f20ba;
          }
          (*io->_vptr_llama_io_read_i[3])(io,&k_size_row_ref,8);
          uVar6 = ggml_row_size((this->v_l).
                                super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar11]->type,uVar5 + uVar4
                               );
          uVar7 = CONCAT44(k_size_row_ref._4_4_,(ggml_type)k_size_row_ref);
          if (uVar6 != uVar7) {
            pcVar10 = "%s: mismatched value row size (%zu != %zu, layer %d)\n";
LAB_001f1f69:
            uVar11 = uVar11 & 0xffffffff;
            goto LAB_001f1f7b;
          }
          if (cell_count != 0) {
            pgVar1 = (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11];
            lVar8 = uVar6 * local_50;
            iVar3 = (*io->_vptr_llama_io_read_i[2])(io,lVar8);
            cell_count = local_68;
            ggml_backend_tensor_set(pgVar1,iVar3,this->head * uVar6,lVar8);
          }
          uVar7 = (ulong)n_layer;
        }
      }
      else {
        local_38 = io;
        for (il = 0; plVar2 = local_38, il < (uint)uVar7; il = il + 1) {
          local_6c = llama_hparams::n_embd_v_gqa(this->hparams,il);
          uVar4 = llama_hparams::n_embd_v_s(this->hparams);
          (*plVar2->_vptr_llama_io_read_i[3])(plVar2,&k_size_row_ref,4);
          gVar12 = (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[il]->type;
          if (gVar12 != (ggml_type)k_size_row_ref) {
            pcVar10 = "%s: mismatched value type (%d != %d, layer %d)\n";
            n_embd_v_gqa_ref = (ggml_type)k_size_row_ref;
LAB_001f20b5:
            uVar11 = (ulong)il;
            k_type_i_ref = n_embd_v_gqa_ref;
LAB_001f20ba:
            llama_log_internal(GGML_LOG_LEVEL_ERROR,pcVar10,"state_read_data",(ulong)gVar12,
                               (ulong)(uint)k_type_i_ref,uVar11);
            return false;
          }
          (*plVar2->_vptr_llama_io_read_i[3])(plVar2,&k_type_i_ref,4);
          uVar6 = ggml_type_size((this->v_l).
                                 super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start[il]->type);
          uVar7 = (ulong)(uint)k_type_i_ref;
          local_48 = uVar6;
          if (uVar6 != uVar7) {
            pcVar10 = "%s: mismatched value element size (%zu != %zu, layer %d)\n";
            uVar11 = (ulong)il;
LAB_001f1f7b:
            llama_log_internal(GGML_LOG_LEVEL_ERROR,pcVar10,"state_read_data",uVar6,uVar7,uVar11);
            return false;
          }
          gVar12 = uVar4 + local_6c;
          (*plVar2->_vptr_llama_io_read_i[3])(plVar2,&n_embd_v_gqa_ref,4);
          local_6c = gVar12;
          if (gVar12 != n_embd_v_gqa_ref) {
            pcVar10 = "%s: mismatched GQA embedding size (%u != %u, layer %d)\n";
            goto LAB_001f20b5;
          }
          if (cell_count != 0) {
            lVar8 = local_48 * local_50;
            for (gVar12 = GGML_TYPE_F32; cell_count = local_68, local_6c != gVar12;
                gVar12 = gVar12 + GGML_TYPE_F16) {
              lVar9 = (this->size * gVar12 + this->head) * local_48;
              pgVar1 = (this->v_l).super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[il];
              iVar3 = (*local_38->_vptr_llama_io_read_i[2])(local_38,lVar8);
              ggml_backend_tensor_set(pgVar1,iVar3,lVar9,lVar8);
            }
          }
          uVar7 = (ulong)n_layer;
        }
      }
      return true;
    }
    pcVar10 = "%s: not enough cells in kv cache to restore state (%u > %u)\n";
    uVar7 = (ulong)cell_count;
  }
  else {
    pcVar10 = "%s: mismatched layer count (%u instead of %u)\n";
  }
  llama_log_internal(GGML_LOG_LEVEL_ERROR,pcVar10,"state_read_data",uVar7);
  return false;
}

Assistant:

bool llama_kv_cache_unified::state_read_data(llama_io_read_i & io, uint32_t cell_count) {
    uint32_t v_trans;
    uint32_t n_layer;
    io.read_to(&v_trans, sizeof(v_trans));
    io.read_to(&n_layer, sizeof(n_layer));

    if (n_layer != hparams.n_layer) {
        LLAMA_LOG_ERROR("%s: mismatched layer count (%u instead of %u)\n", __func__, n_layer, hparams.n_layer);
        return false;
    }
    if (cell_count > size) {
        LLAMA_LOG_ERROR("%s: not enough cells in kv cache to restore state (%u > %u)\n", __func__, cell_count, size);
        return false;
    }
    if (v_trans != (bool) v_trans) {
        LLAMA_LOG_ERROR("%s: incompatible V transposition\n", __func__);
        return false;
    }

    // For each layer, read the keys for each cell, one row is one cell, read as one contiguous block
    for (uint32_t il = 0; il < n_layer; ++il) {
        const uint32_t n_embd_k_gqa = hparams.n_embd_k_gqa(il) + hparams.n_embd_k_s();

        // Read type of key
        int32_t k_type_i_ref;
        io.read_to(&k_type_i_ref, sizeof(k_type_i_ref));
        const int32_t k_type_i = (int32_t) k_l[il]->type;
        if (k_type_i != k_type_i_ref) {
            LLAMA_LOG_ERROR("%s: mismatched key type (%d != %d, layer %d)\n", __func__, k_type_i, k_type_i_ref, il);
            return false;
        }

        // Read row size of key
        uint64_t k_size_row_ref;
        io.read_to(&k_size_row_ref, sizeof(k_size_row_ref));
        const size_t k_size_row = ggml_row_size(k_l[il]->type, n_embd_k_gqa);
        if (k_size_row != k_size_row_ref) {
            LLAMA_LOG_ERROR("%s: mismatched key row size (%zu != %zu, layer %d)\n", __func__, k_size_row, (size_t) k_size_row_ref, il);
            return false;
        }

        if (cell_count) {
            // Read and set the keys for the whole cell range
            ggml_backend_tensor_set(k_l[il], io.read(cell_count * k_size_row), head * k_size_row, cell_count * k_size_row);
        }
    }

    if (!v_trans) {
        for (uint32_t il = 0; il < n_layer; ++il) {
            const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa(il) + hparams.n_embd_v_s();

            // Read type of value
            int32_t v_type_i_ref;
            io.read_to(&v_type_i_ref, sizeof(v_type_i_ref));
            const int32_t v_type_i = (int32_t)v_l[il]->type;
            if (v_type_i != v_type_i_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value type (%d != %d, layer %d)\n", __func__, v_type_i, v_type_i_ref, il);
                return false;
            }

            // Read row size of value
            uint64_t v_size_row_ref;
            io.read_to(&v_size_row_ref, sizeof(v_size_row_ref));
            const size_t v_size_row = ggml_row_size(v_l[il]->type, n_embd_v_gqa);
            if (v_size_row != v_size_row_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value row size (%zu != %zu, layer %d)\n", __func__, v_size_row, (size_t) v_size_row_ref, il);
                return false;
            }

            if (cell_count) {
                // Read and set the values for the whole cell range
                ggml_backend_tensor_set(v_l[il], io.read(cell_count * v_size_row), head * v_size_row, cell_count * v_size_row);
            }
        }
    } else {
        // For each layer, read the values for each cell (transposed)
        for (uint32_t il = 0; il < n_layer; ++il) {
            const uint32_t n_embd_v_gqa = hparams.n_embd_v_gqa(il) + hparams.n_embd_v_s();

            // Read type of value
            int32_t v_type_i_ref;
            io.read_to(&v_type_i_ref, sizeof(v_type_i_ref));
            const int32_t v_type_i = (int32_t)v_l[il]->type;
            if (v_type_i != v_type_i_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value type (%d != %d, layer %d)\n", __func__, v_type_i, v_type_i_ref, il);
                return false;
            }

            // Read element size of value
            uint32_t v_size_el_ref;
            io.read_to(&v_size_el_ref, sizeof(v_size_el_ref));
            const size_t v_size_el = ggml_type_size(v_l[il]->type);
            if (v_size_el != v_size_el_ref) {
                LLAMA_LOG_ERROR("%s: mismatched value element size (%zu != %zu, layer %d)\n", __func__, v_size_el, (size_t) v_size_el_ref, il);
                return false;
            }

            // Read GQA embedding size
            uint32_t n_embd_v_gqa_ref;
            io.read_to(&n_embd_v_gqa_ref, sizeof(n_embd_v_gqa_ref));
            if (n_embd_v_gqa != n_embd_v_gqa_ref) {
                LLAMA_LOG_ERROR("%s: mismatched GQA embedding size (%u != %u, layer %d)\n", __func__, n_embd_v_gqa, n_embd_v_gqa_ref, il);
                return false;
            }

            if (cell_count) {
                // For each row in the transposed matrix, read the values for the whole cell range
                for (uint32_t j = 0; j < n_embd_v_gqa; ++j) {
                    const size_t dst_offset = (head + j * size) * v_size_el;
                    ggml_backend_tensor_set(v_l[il], io.read(cell_count * v_size_el), dst_offset, cell_count * v_size_el);
                }
            }
        }
    }

    return true;
}